

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<tonk::Connection::OnNATProbe(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_int,tonk::ConnectionAddrMap*,tonk::IUDPSender*)::__0,tonk::Connection::OnNATProbe(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_int,tonk::ConnectionAddrMap*,tonk::IUDPSender*)::__0>
               (type *function,type *context)

{
  undefined8 in_RSI;
  type *in_RDI;
  
  asio::
  asio_handler_invoke<tonk::Connection::OnNATProbe(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_int,tonk::ConnectionAddrMap*,tonk::IUDPSender*)::__0>
            (in_RDI,in_RSI);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}